

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O3

void __thiscall
testing::Matcher<const_SDL_Surface_*>::Matcher
          (Matcher<const_SDL_Surface_*> *this,SDL_Surface *value)

{
  MatcherBase<const_SDL_Surface_*> local_28;
  
  (this->super_MatcherBase<const_SDL_Surface_*>).vtable_ = (VTable *)0x0;
  (this->super_MatcherBase<const_SDL_Surface_*>).super_MatcherDescriberInterface.
  _vptr_MatcherDescriberInterface = (_func_int **)&PTR__MatcherBase_00329928;
  local_28.vtable_ =
       (VTable *)
       internal::MatcherBase<SDL_Surface_const*>::
       GetVTable<testing::internal::MatcherBase<SDL_Surface_const*>::ValuePolicy<testing::internal::EqMatcher<SDL_Surface_const*>,true>>()
       ::kVTable;
  local_28.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00329928;
  local_28.buffer_ = (Buffer)value;
  internal::MatcherBase<const_SDL_Surface_*>::operator=
            (&this->super_MatcherBase<const_SDL_Surface_*>,&local_28);
  internal::MatcherBase<const_SDL_Surface_*>::~MatcherBase(&local_28);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }